

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O2

void __thiscall IRCCommand::setAccessLevel(IRCCommand *this,string_view channel,int accessLevel)

{
  allocator<char> local_51;
  ChannelAccessPair local_50;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = channel._M_str;
  local_28._M_len = channel._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_28,&local_51);
  local_50.access = accessLevel;
  std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>::
  emplace_back<IRCCommand::ChannelAccessPair>(&this->m_channels,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void IRCCommand::setAccessLevel(std::string_view channel, int accessLevel) {
	m_channels.push_back({ static_cast<std::string>(channel), accessLevel });
}